

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

bool __thiscall wallet::CWallet::LoadWalletFlags(CWallet *this,uint64_t flags)

{
  ulong in_RSI;
  __atomic_base<unsigned_long> *in_RDI;
  long in_FS_OFFSET;
  byte bVar1;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock35;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  char *in_stack_ffffffffffffffe8;
  AnnotatedMixin<std::recursive_mutex> *in_stack_fffffffffffffff0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *this_00;
  
  this_00 = *(UniqueLock<AnnotatedMixin<std::recursive_mutex>_> **)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (this_00,in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,
             (char *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
             (int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
  bVar1 = (in_RSI & 0xf00000007 ^ in_RSI) >> 0x20 == 0;
  if ((bool)bVar1) {
    std::__atomic_base<unsigned_long>::operator=(in_RDI,in_RSI);
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  if (*(UniqueLock<AnnotatedMixin<std::recursive_mutex>_> **)(in_FS_OFFSET + 0x28) != this_00) {
    __stack_chk_fail();
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool CWallet::LoadWalletFlags(uint64_t flags)
{
    LOCK(cs_wallet);
    if (((flags & KNOWN_WALLET_FLAGS) >> 32) ^ (flags >> 32)) {
        // contains unknown non-tolerable wallet flags
        return false;
    }
    m_wallet_flags = flags;

    return true;
}